

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  bool bVar2;
  ostream *poVar3;
  istream *piVar4;
  double value;
  shared_ptr<calc::Node> ast;
  string expression;
  vector<calc::Token,_std::allocator<calc::Token>_> tokens;
  undefined8 *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  vector<calc::Token,_std::allocator<calc::Token>_> local_68;
  string local_50;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"abac console calculator v1.0");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"To exit enter \"exit\"");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Enter arithmetic expression: ");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::operator<<((ostream *)&std::cout,":> ");
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&std::cin,(string *)&local_88);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
    bVar2 = std::operator==(&local_88,"exit");
    if (bVar2) break;
    std::__cxx11::string::string((string *)&local_50,(string *)&local_88);
    calc::tokenize(&local_68,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    calc::buildAST((calc *)&local_98,&local_68);
    value = (double)(**(code **)*local_98)();
    bVar2 = isInteger(value);
    lVar1 = std::cout;
    if (!bVar2) {
      *(uint *)(std::operator>> + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::operator>> + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 2;
    }
    poVar3 = std::ostream::_M_insert<double>(value);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
    std::vector<calc::Token,_std::allocator<calc::Token>_>::~vector(&local_68);
    std::operator<<((ostream *)&std::cout,":> ");
  }
  std::__cxx11::string::~string((string *)&local_88);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	cout << "abac console calculator v1.0" << endl;
	cout << "To exit enter \"exit\"" << endl;
	cout << "Enter arithmetic expression: " << endl;
	cout << ":> ";
	string expression;
	while (getline(cin, expression))
	{
		if (expression == "exit")
			break;
		try
		{
			const auto tokens = calc::tokenize(expression);
			const auto ast = calc::buildAST(tokens);
			double result = ast->eval();
			if (isInteger(result))
			{
				cout << result << endl;
			}
			else
			{
				cout << fixed << setprecision(2) << result << endl;
			}
		}
		catch (logic_error & e)
		{
			cout << "Error: " << e.what() << endl;
		}
		cout << ":> ";
	}

	return 0;
}